

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvbocu.cpp
# Opt level: O0

int32_t bocu1Prev(int32_t c)

{
  undefined4 local_c;
  int32_t c_local;
  
  if (c < 0x30a0) {
    local_c = 0x3070;
  }
  else if ((c < 0x4e00) || (0x9fa5 < c)) {
    if (c < 0xac00) {
      local_c = (c & 0xffffff80U) + 0x40;
    }
    else {
      local_c = 0xc1d1;
    }
  }
  else {
    local_c = 0x7711;
  }
  return local_c;
}

Assistant:

static inline int32_t
bocu1Prev(int32_t c) {
    /* compute new prev */
    if(/* 0x3040<=c && */ c<=0x309f) {
        /* Hiragana is not 128-aligned */
        return 0x3070;
    } else if(0x4e00<=c && c<=0x9fa5) {
        /* CJK Unihan */
        return 0x4e00-BOCU1_REACH_NEG_2;
    } else if(0xac00<=c /* && c<=0xd7a3 */) {
        /* Korean Hangul */
        return (0xd7a3+0xac00)/2;
    } else {
        /* mostly small scripts */
        return BOCU1_SIMPLE_PREV(c);
    }
}